

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O1

void __thiscall
gutil::Parameter::Parameter(Parameter *this,int argc,char **argv,char **pdef,char *creator)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  IOException *this_00;
  size_t sVar6;
  char **ppcVar7;
  char *pcVar8;
  ulong uVar9;
  string s;
  ifstream in;
  string local_2a8;
  string *local_288;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  char *local_268;
  ulong local_260;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  int aiStack_218 [122];
  
  local_278 = &this->def;
  local_288 = &this->creat;
  local_270 = &(this->creat).field_2;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->creat)._M_dataplus._M_p = (pointer)local_270;
  (this->creat)._M_string_length = 0;
  (this->creat).field_2._M_local_buf[0] = '\0';
  local_280 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->allparam;
  p_Var1 = &(this->allparam)._M_t._M_impl.super__Rb_tree_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268 = creator;
  if (1 < argc) {
    local_260 = (ulong)(uint)argc;
    uVar9 = 1;
    do {
      if (*argv[uVar9] == '@') {
        std::ifstream::ifstream(&local_238);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        local_2a8._M_string_length = 0;
        local_2a8.field_2._M_local_buf[0] = '\0';
        lVar3 = *(long *)(local_238._M_dataplus._M_p + -0x18);
        *(undefined4 *)((long)aiStack_218 + lVar3 + -4) = 1;
        std::ios::clear((int)&local_238 + (int)lVar3);
        std::ifstream::open((char *)&local_238,(int)argv[uVar9] + _S_app);
        if (*(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) != 0) {
          this_00 = (IOException *)__cxa_allocate_exception(0x28);
          pcVar4 = argv[uVar9];
          pcVar8 = pcVar4 + 1;
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          sVar6 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,pcVar8,pcVar4 + sVar6 + 1);
          IOException::IOException(this_00,&local_258);
          __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
        }
        lVar3 = *(long *)(local_238._M_dataplus._M_p + -0x18);
        iVar2 = *(int *)((long)aiStack_218 + lVar3);
        while (iVar2 == 0) {
          cVar5 = std::ios::widen((char)&local_2a8 + (char)lVar3 + 'p');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_238,(string *)&local_2a8,cVar5);
          trim(&local_2a8);
          if (local_2a8._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->list,&local_2a8);
          }
          lVar3 = *(long *)(local_238._M_dataplus._M_p + -0x18);
          iVar2 = *(int *)((long)aiStack_218 + lVar3);
        }
        std::ifstream::close();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        std::ifstream::~ifstream(&local_238);
      }
      else {
        std::__cxx11::string::string((string *)&local_238,argv[uVar9],(allocator *)&local_2a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   &local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_260);
  }
  pcVar4 = local_268;
  pcVar8 = *pdef;
  if (pcVar8 != (char *)0x0) {
    ppcVar7 = pdef + 1;
    do {
      std::__cxx11::string::string((string *)&local_238,pcVar8,(allocator *)&local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_278,&local_238);
      anon_unknown_4::getValue(&local_2a8,&local_238);
      std::__cxx11::string::operator=((string *)&local_238,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      if ((local_238._M_string_length != 0) && (*local_238._M_dataplus._M_p == '-')) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_280,&local_238);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      pcVar8 = *ppcVar7;
      ppcVar7 = ppcVar7 + 1;
    } while (pcVar8 != (char *)0x0);
  }
  if (pcVar4 != (char *)0x0) {
    pcVar8 = (char *)(this->creat)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)local_288,0,pcVar8,(ulong)pcVar4);
  }
  this->cparam = 0xffffffffffffffff;
  this->pos = 0;
  return;
}

Assistant:

Parameter::Parameter(int argc, char *argv[], const char *pdef[],
                     const char *creator)
{
  for (int i=1; i<argc; i++)
  {
    if (argv[i][0] == '@')
    {
      std::ifstream in;
      std::string s;

      in.exceptions(std::ios_base::badbit);
      in.open(argv[i]+1);

      if (!in.good())
      {
        throw IOException(argv[i]+1);
      }

      while (in.good())
      {
        getline(in, s);

        trim(s);

        if (s.size() > 0)
        {
          list.push_back(s);
        }
      }

      in.close();
    }
    else
    {
      list.push_back(std::string(argv[i]));
    }
  }

  for (int i=0; pdef[i] != 0; i++)
  {
    std::string s=pdef[i];
    def.push_back(s);

    s=getValue(s);

    if (s.size() > 0 && s[0] == '-')
    {
      allparam.insert(s);
    }
  }

  if (creator != 0)
  {
    creat=creator;
  }

  cparam=-1;
  pos=0;
}